

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::
FunctionMockerBase<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)>
::~FunctionMockerBase
          (FunctionMockerBase<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)>
           *this)

{
  MutexBase *in_RDI;
  MutexLock l;
  UntypedFunctionMockerBase *in_stack_00000240;
  UntypedFunctionMockerBase *in_stack_fffffffffffffff0;
  
  (in_RDI->mutex_).__align = (long)&PTR__FunctionMockerBase_0029f810;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)in_stack_fffffffffffffff0,in_RDI);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked(in_stack_00000240);
  Mock::UnregisterLocked(&this->super_UntypedFunctionMockerBase);
  (**(code **)((in_RDI->mutex_).__align + 0x10))();
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x171a3e);
  MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)>
  ::~MockSpec((MockSpec<TestResult_(mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)>
               *)0x171a4b);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(in_stack_fffffffffffffff0);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }